

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O2

void kmpc_get_poolstat(size_t *maxmem,size_t *allmem)

{
  kmp_info_t *th;
  long lVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  iVar2 = __kmp_get_global_thread_id();
  th = __kmp_threads[iVar2];
  __kmp_bget_dequeue(th);
  sVar3 = 0;
  sVar4 = 0;
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 1) {
    lVar7 = lVar6 * 0x30 + *(long *)(th->th_pad + 0x120);
    lVar8 = lVar7;
    lVar1 = lVar7;
    while (lVar9 = lVar1, lVar8 = *(long *)(lVar8 + 0x20), lVar8 != lVar7) {
      sVar4 = (sVar4 + *(long *)(lVar8 + 0x10)) - 0x20;
      lVar1 = lVar8;
      if ((lVar9 != lVar7) && (lVar1 = lVar9, *(long *)(lVar8 + 0x10) < *(long *)(lVar9 + 0x10))) {
        lVar1 = lVar8;
      }
    }
    if ((long)sVar3 <= (long)*(size_t *)(lVar9 + 0x10)) {
      sVar3 = *(size_t *)(lVar9 + 0x10);
    }
  }
  sVar5 = sVar3 - 0x20;
  if ((long)sVar3 < 0x21) {
    sVar5 = sVar3;
  }
  *maxmem = sVar5;
  *allmem = sVar4;
  return;
}

Assistant:

void kmpc_get_poolstat(size_t *maxmem, size_t *allmem) {
  kmp_info_t *th = __kmp_get_thread();
  bufsize a, b;

  __kmp_bget_dequeue(th); /* Release any queued buffers */

  bcheck(th, &a, &b);

  *maxmem = a;
  *allmem = b;
}